

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EstimatorUtilStats.h
# Opt level: O0

void WriteAlgorithmOutput(FILE *f,string *algo_name,Parameters *params,EstimatorStats est_stats)

{
  undefined8 uVar1;
  Parameters *params_local;
  string *algo_name_local;
  FILE *f_local;
  
  uVar1 = std::__cxx11::string::c_str();
  fprintf((FILE *)f,"#--------------------------------------------------------%s\n",uVar1);
  fprintf((FILE *)f,
          "#Results: Mean Err, Median Err, Max Err, stddev Err (in %%) of simple sampling\n");
  fprintf((FILE *)f,"%.3lf,%.3lf,%.3lf,%.3lf \n\n",est_stats.mean_error_percentage,
          est_stats.median_error_percentage,est_stats.max_error_percentage,
          est_stats.stddev_error_percentage);
  fprintf((FILE *)f,
          "Query Complexity, Fraction of edges seen, fraction of vertices seen(maximum over all run)\n"
         );
  fprintf((FILE *)f,"%.6lf,%.6lf,%.6lf\n\n",est_stats.query_complexity_max_percentage,
          est_stats.edges_seen_max_percentage,est_stats.vertices_seen_max_percentage);
  return;
}

Assistant:

void WriteAlgorithmOutput(FILE *f, std::string algo_name, Parameters params,
                          EstimatorStats est_stats) {
    fprintf(f, "#--------------------------------------------------------%s\n", algo_name.c_str());
    fprintf(f, "#Results: Mean Err, Median Err, Max Err, stddev Err (in %%) of simple sampling\n");
    fprintf(f, "%.3lf,%.3lf,%.3lf,%.3lf \n\n", est_stats.mean_error_percentage,
            est_stats.median_error_percentage, est_stats.max_error_percentage,
            est_stats.stddev_error_percentage);
    fprintf(f, "Query Complexity, Fraction of edges seen, fraction of vertices seen(maximum over all run)\n");
    fprintf(f, "%.6lf,%.6lf,%.6lf\n\n", est_stats.query_complexity_max_percentage, est_stats.edges_seen_max_percentage,
            est_stats.vertices_seen_max_percentage);
}